

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::getFormattedDuration_abi_cxx11_(string *__return_storage_ptr__,Catch *this,double duration)

{
  size_t sVar1;
  ErrnoGuard guard;
  char buffer [314];
  ErrnoGuard local_164;
  double local_160;
  char local_158 [328];
  
  local_160 = duration;
  ErrnoGuard::ErrnoGuard(&local_164);
  sprintf(local_158,"%.3f",local_160);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_158);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_158,local_158 + sVar1);
  ErrnoGuard::~ErrnoGuard(&local_164);
  return __return_storage_ptr__;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        sprintf_s(buffer, "%.3f", duration);
#else
        std::sprintf(buffer, "%.3f", duration);
#endif
        return std::string(buffer);
    }